

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O1

void __thiscall
CoreML::NeuralNetworkShaper::shapeEmbeddingLayer
          (NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  LogMessage *pLVar1;
  mapped_type *this_00;
  mapped_type *this_01;
  ShapeRange *pSVar2;
  LayerUnion from;
  EmbeddingLayerParams embedding;
  EmbeddingLayerParams EStack_108;
  LogMessage local_d0;
  LogMessage local_98;
  LogMessage local_60;
  
  if ((specLayer->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_98,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar1 = google::protobuf::internal::LogMessage::operator<<
                       (&local_98,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_d0,pLVar1);
    google::protobuf::internal::LogMessage::~LogMessage(&local_98);
  }
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,
                         (key_type *)
                         ((specLayer->input_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar1 = google::protobuf::internal::LogMessage::operator<<
                       (&local_60,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_d0,pLVar1);
    google::protobuf::internal::LogMessage::~LogMessage(&local_60);
  }
  this_01 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,
                         (key_type *)
                         ((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_d0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar1 = google::protobuf::internal::LogMessage::operator<<
                       (&local_d0,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&EStack_108,pLVar1);
    google::protobuf::internal::LogMessage::~LogMessage(&local_d0);
  }
  ShapeConstraint::setName
            (this_01,(string *)((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  pSVar2 = ShapeConstraint::sequenceRange(this_00);
  ShapeConstraint::updateSequenceRange(this_01,pSVar2);
  pSVar2 = ShapeConstraint::batchRange(this_00);
  ShapeConstraint::updateBatchRange(this_01,pSVar2);
  pSVar2 = ShapeConstraint::sequenceRange(this_01);
  ShapeConstraint::updateSequenceRange(this_00,pSVar2);
  pSVar2 = ShapeConstraint::batchRange(this_01);
  ShapeConstraint::updateBatchRange(this_00,pSVar2);
  if (specLayer->_oneof_case_[0] == 0x96) {
    from = specLayer->layer_;
  }
  else {
    from.embedding_ = Specification::EmbeddingLayerParams::default_instance();
  }
  Specification::EmbeddingLayerParams::EmbeddingLayerParams(&EStack_108,from.embedding_);
  ShapeConstraint::setChannel(this_00,1);
  ShapeConstraint::setHeight(this_00,1);
  ShapeConstraint::setWidth(this_00,1);
  ShapeConstraint::setChannel(this_01,EStack_108.outputchannels_);
  ShapeConstraint::setHeight(this_01,1);
  ShapeConstraint::setWidth(this_01,1);
  Specification::EmbeddingLayerParams::~EmbeddingLayerParams(&EStack_108);
  return;
}

Assistant:

void NeuralNetworkShaper::shapeEmbeddingLayer(const Specification::NeuralNetworkLayer& specLayer) {

    ShapeConstraint& inputShape = blobShapes[specLayer.input(0)];

    // Check if this already exists? Can't -- outputs are only generated by one layer
    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    outputShape.setName(specLayer.output(0));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Embedding layer " << specLayer.name() << " input shapes (before): " << std::endl;
    std::cout << inputShape;
    std::cout << "Embedding layer " << specLayer.name() << " output shapes (before): " << std::endl;
    std::cout << outputShape;
#endif

    outputShape.updateSequenceRange(inputShape.sequenceRange());
    outputShape.updateBatchRange(inputShape.batchRange());

    inputShape.updateSequenceRange(outputShape.sequenceRange());
    inputShape.updateBatchRange(outputShape.batchRange());

    Specification::EmbeddingLayerParams embedding = specLayer.embedding();

    // all three inputs need to be one
    inputShape.setChannel(1);
    inputShape.setHeight(1);
    inputShape.setWidth(1);

    outputShape.setChannel((size_t)embedding.outputchannels());
    outputShape.setHeight(1);
    outputShape.setWidth(1);

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Embedding layer " << specLayer.name() << " input shapes (after): " << std::endl;
    std::cout << inputShape;
    std::cout << "Embedding layer " << specLayer.name() << " output shapes (after): " << std::endl;
    std::cout << outputShape;
#endif

}